

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

void Fra_ClassesLatchCorr(Fra_Man_t *p)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  Fra_Cla_t *pFVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Aig_Obj_t **ppAVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  p->pCla->vClasses1->nSize = 0;
  pAVar2 = p->pManAig;
  uVar8 = pAVar2->nObjs[2] - pAVar2->nRegs;
  pVVar5 = pAVar2->vCis;
  if ((int)uVar8 < pVVar5->nSize) {
    uVar10 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar5->pArray[uVar10];
      pVVar5 = p->pCla->vClasses1;
      uVar1 = pVVar5->nCap;
      if (pVVar5->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar1 * 2;
          if (iVar9 <= (int)uVar1) goto LAB_005f1d13;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar9;
      }
LAB_005f1d13:
      iVar9 = pVVar5->nSize;
      pVVar5->nSize = iVar9 + 1;
      pVVar5->pArray[iVar9] = pvVar3;
      *(Aig_Obj_t **)
       (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x30) + 8) +
       (long)*(int *)((long)pvVar3 + 0x24) * 8) = p->pManAig->pConst1;
      uVar10 = uVar10 + 1;
      pVVar5 = p->pManAig->vCis;
    } while ((int)uVar10 < pVVar5->nSize);
  }
  pFVar4 = p->pCla;
  ppAVar7 = (Aig_Obj_t **)malloc((long)pFVar4->vClasses1->nSize << 4);
  pFVar4->pMemClasses = ppAVar7;
  pFVar4->pMemClassesFree = ppAVar7;
  return;
}

Assistant:

void Fra_ClassesLatchCorr( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEntries = 0;
    Vec_PtrClear( p->pCla->vClasses1 );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Vec_PtrPush( p->pCla->vClasses1, pObj );
        Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pManAig) );
    }
    // allocate room for classes
    p->pCla->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->pCla->vClasses1)) );
    p->pCla->pMemClassesFree = p->pCla->pMemClasses + 2*nEntries;
}